

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.h
# Opt level: O0

void __thiscall fmp4_stream::mfhd::mfhd(mfhd *this)

{
  allocator local_31;
  string local_30 [32];
  mfhd *local_10;
  mfhd *this_local;
  
  local_10 = this;
  full_box::full_box(&this->super_full_box);
  (this->super_full_box).super_box._vptr_box = (_func_int **)&PTR_size_001463e8;
  *(undefined4 *)&(this->super_full_box).field_0x6c = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"mfhd",&local_31);
  std::__cxx11::string::operator=((string *)&(this->super_full_box).super_box.box_type_,local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

uint64_t size() const { return full_box::size() + 4; }